

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qundostack.cpp
# Opt level: O3

void __thiscall QUndoStack::~QUndoStack(QUndoStack *this)

{
  QUndoGroup *this_00;
  
  *(undefined ***)this = &PTR_metaObject_007e1e18;
  this_00 = *(QUndoGroup **)(*(long *)&this->field_0x8 + 0xb0);
  if (this_00 != (QUndoGroup *)0x0) {
    QUndoGroup::removeStack(this_00,this);
  }
  clear(this);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QUndoStack::~QUndoStack()
{
#if QT_CONFIG(undogroup)
    Q_D(QUndoStack);
    if (d->group != nullptr)
        d->group->removeStack(this);
#endif
    clear();
}